

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O1

PoComp __thiscall
Kernel::TermPartialOrdering::getOneExternal(TermPartialOrdering *this,TermList t,size_t idx)

{
  Entry *pEVar1;
  PoComp PVar2;
  uint uVar3;
  int iVar4;
  uint unaff_EBP;
  Entry *e;
  Entry *pEVar5;
  bool bVar6;
  PoComp res;
  PoComp local_49;
  MaybeUninit<unsigned_long> local_48;
  TermPartialOrdering *local_40;
  uint64_t local_38;
  
  local_49 = UNKNOWN;
  pEVar5 = (this->_nodes)._entries;
  pEVar1 = (this->_nodes)._afterLast;
  local_48 = (MaybeUninit<unsigned_long>)idx;
  local_40 = this;
  local_38 = t._content;
  do {
    bVar6 = pEVar5 != pEVar1;
    if (bVar6) {
      uVar3 = pEVar5->code;
      while (uVar3 == 0) {
        pEVar5 = pEVar5 + 1;
        bVar6 = pEVar5 != pEVar1;
        if (pEVar5 == pEVar1) break;
        uVar3 = pEVar5->code;
      }
    }
    if (!bVar6) {
      return local_49;
    }
    bVar6 = false;
    if (pEVar5->_value == (MaybeUninit<unsigned_long>)idx) goto LAB_005e5927;
    PVar2 = PartialOrdering::get(this->_po,(size_t)pEVar5->_value,idx);
    idx = (size_t)local_48;
    uVar3 = unaff_EBP;
    if (PVar2 != UNKNOWN) {
      uVar3 = (uint)PVar2;
      iVar4 = (*this->_ord->_vptr_Ordering[3])(this->_ord,local_38,pEVar5->_key);
      bVar6 = true;
      idx = (size_t)local_48;
      this = local_40;
      if (iVar4 != 3) {
        if (iVar4 == 2) {
          if (uVar3 - 2 < 2) {
            PVar2 = LESS;
LAB_005e58e1:
            checkCompatibility(local_49,PVar2,&local_49);
            idx = (size_t)local_48;
            this = local_40;
            uVar3 = (uint)local_49;
            goto LAB_005e592a;
          }
          if ((uVar3 == 4) || (uVar3 == 6)) {
            PVar2 = NGEQ;
LAB_005e5906:
            checkCompatibility(local_49,PVar2,&local_49);
            idx = (size_t)local_48;
            this = local_40;
            uVar3 = 6;
            if (local_49 == INCOMPARABLE) goto LAB_005e592a;
          }
        }
        else if (iVar4 == 1) {
          if (uVar3 - 5 < 2) {
            PVar2 = NLEQ;
            goto LAB_005e5906;
          }
          if (uVar3 - 1 < 2) {
            PVar2 = GREATER;
            goto LAB_005e58e1;
          }
        }
LAB_005e5927:
        bVar6 = false;
        uVar3 = unaff_EBP;
      }
    }
LAB_005e592a:
    pEVar5 = pEVar5 + 1;
    unaff_EBP = uVar3;
    if (bVar6) {
      return (PoComp)uVar3;
    }
  } while( true );
}

Assistant:

PoComp TermPartialOrdering::getOneExternal(TermList t, size_t idx) const
{
  PoComp res = PoComp::UNKNOWN;
  decltype(_nodes)::Iterator it(_nodes);
  while (it.hasNext()) {
    auto& e = it.next();
    if (e.value()==idx) {
      continue;
    }
    auto val = _po->get(e.value(),idx);
    if (val == PoComp::UNKNOWN) {
      continue;
    }
    auto comp = _ord.compare(t,e.key());
    switch (comp) {
      case Ordering::GREATER: {
        switch (val) {
          case PoComp::EQUAL:
          case PoComp::GREATER:
            // t > e ≥ x -> t > x
            ALWAYS(checkCompatibility(res, PoComp::GREATER, res));
            return res;
          case PoComp::NLEQ:
          case PoComp::INCOMPARABLE:
            // t > e ≰ x -> t ≰ x
            ALWAYS(checkCompatibility(res, PoComp::NLEQ, res));
            if (res == PoComp::INCOMPARABLE) {
              return res;
            }
          default:
            break;
        }
        break;
      }
      case Ordering::EQUAL: {
        return val;
      }
      case Ordering::LESS: {
        switch (val) {
          case PoComp::EQUAL:
          case PoComp::LESS:
            // t < e ≤ x -> t < x
            ALWAYS(checkCompatibility(res, PoComp::LESS, res));
            return res;
          case PoComp::NGEQ:
          case PoComp::INCOMPARABLE:
            // t < e ≱ x -> t ≱ x
            ALWAYS(checkCompatibility(res, PoComp::NGEQ, res));
            if (res == PoComp::INCOMPARABLE) {
              return res;
            }
          default:
            break;
        }
        break;
      }
      case Ordering::INCOMPARABLE: {
        break;
      }
    }
  }
  return res;
}